

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O0

void __thiscall Camera::move_forward(Camera *this,float dist,float dir)

{
  float *in_RDI;
  float in_XMM0_Da;
  double dVar1;
  float in_XMM1_Da;
  
  dVar1 = std::sin((double)(ulong)(uint)(in_RDI[3] + in_XMM1_Da));
  *in_RDI = SUB84(dVar1,0) * in_XMM0_Da + *in_RDI;
  dVar1 = std::cos((double)(ulong)(uint)(in_RDI[3] + in_XMM1_Da));
  in_RDI[2] = SUB84(dVar1,0) * in_XMM0_Da + in_RDI[2];
  return;
}

Assistant:

void Camera::move_forward(float dist, float dir) {
	m_position.x += glm::sin(m_yaw + dir) * dist;
	m_position.z += glm::cos(m_yaw + dir) * dist;
}